

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 jsonCreateEditSubstructure(JsonParse *pParse,JsonParse *pIns,char *zTail)

{
  char *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int rc;
  u32 in_stack_0000002c;
  char *in_stack_00000030;
  u32 in_stack_0000003c;
  JsonParse *in_stack_00000040;
  u32 local_1c;
  
  memset(in_RSI,0,0x48);
  in_RSI[3] = *(undefined8 *)(in_RDI + 0x18);
  if (*in_RDX == '\0') {
    *in_RSI = *(undefined8 *)(in_RDI + 0x40);
    *(undefined4 *)(in_RSI + 1) = *(undefined4 *)(in_RDI + 0x38);
    local_1c = 0;
  }
  else {
    *(undefined4 *)(in_RSI + 1) = 1;
    *in_RSI = "\v\f" + (int)(uint)(*in_RDX == '.');
    *(undefined1 *)((long)in_RSI + 0x33) = *(undefined1 *)(in_RDI + 0x33);
    *(undefined4 *)(in_RSI + 7) = *(undefined4 *)(in_RDI + 0x38);
    in_RSI[8] = *(undefined8 *)(in_RDI + 0x40);
    local_1c = jsonLookupStep(in_stack_00000040,in_stack_0000003c,in_stack_00000030,
                              in_stack_0000002c);
    *(byte *)(in_RDI + 0x2f) = *(byte *)(in_RDI + 0x2f) | *(byte *)((long)in_RSI + 0x2f);
  }
  return local_1c;
}

Assistant:

static u32 jsonCreateEditSubstructure(
  JsonParse *pParse,  /* The original JSONB that is being edited */
  JsonParse *pIns,    /* Populate this with the blob data to insert */
  const char *zTail   /* Tail of the path that determins substructure */
){
  static const u8 emptyObject[] = { JSONB_ARRAY, JSONB_OBJECT };
  int rc;
  memset(pIns, 0, sizeof(*pIns));
  pIns->db = pParse->db;
  if( zTail[0]==0 ){
    /* No substructure.  Just insert what is given in pParse. */
    pIns->aBlob = pParse->aIns;
    pIns->nBlob = pParse->nIns;
    rc = 0;
  }else{
    /* Construct the binary substructure */
    pIns->nBlob = 1;
    pIns->aBlob = (u8*)&emptyObject[zTail[0]=='.'];
    pIns->eEdit = pParse->eEdit;
    pIns->nIns = pParse->nIns;
    pIns->aIns = pParse->aIns;
    rc = jsonLookupStep(pIns, 0, zTail, 0);
    pParse->oom |= pIns->oom;
  }
  return rc;  /* Error code only */
}